

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::DictionaryFeatureType::MergeFrom
          (DictionaryFeatureType *this,DictionaryFeatureType *from)

{
  void *pvVar1;
  LogMessage *other;
  StringFeatureType *this_00;
  StringFeatureType *from_00;
  Int64FeatureType *this_01;
  Int64FeatureType *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O2/mlmodel/format/FeatureTypes.pb.cc"
               ,0xeb2);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (from->_oneof_case_[0] == 1) {
    this_01 = mutable_int64keytype(this);
    from_01 = int64keytype(from);
    Int64FeatureType::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 2) {
    this_00 = mutable_stringkeytype(this);
    from_00 = stringkeytype(from);
    StringFeatureType::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

void DictionaryFeatureType::MergeFrom(const DictionaryFeatureType& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.DictionaryFeatureType)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.KeyType_case()) {
    case kInt64KeyType: {
      mutable_int64keytype()->::CoreML::Specification::Int64FeatureType::MergeFrom(from.int64keytype());
      break;
    }
    case kStringKeyType: {
      mutable_stringkeytype()->::CoreML::Specification::StringFeatureType::MergeFrom(from.stringkeytype());
      break;
    }
    case KEYTYPE_NOT_SET: {
      break;
    }
  }
}